

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O1

SuffixTreeInternalNode * __thiscall
wasm::SuffixTree::insertInternalNode
          (SuffixTree *this,SuffixTreeInternalNode *Parent,uint StartIdx,uint EndIdx,uint Edge)

{
  SuffixTreeInternalNode *pSVar1;
  SuffixTreeInternalNode *pSVar2;
  mapped_type *ppSVar3;
  key_type local_34 [2];
  uint Edge_local;
  
  if (EndIdx < StartIdx) {
    __assert_fail("StartIdx <= EndIdx && \"String can\'t start after it ends!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/suffix_tree.cpp"
                  ,0x48,
                  "SuffixTreeInternalNode *wasm::SuffixTree::insertInternalNode(SuffixTreeInternalNode *, unsigned int, unsigned int, unsigned int)"
                 );
  }
  if (Parent != (SuffixTreeInternalNode *)0x0 || StartIdx == 0xffffffff) {
    pSVar2 = (SuffixTreeInternalNode *)
             llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                       (&(this->InternalNodeAllocator).Allocator,0x58,(Align)0x3);
    pSVar1 = this->Root;
    (pSVar2->super_SuffixTreeNode).Kind = ST_Internal;
    (pSVar2->super_SuffixTreeNode).StartIdx = StartIdx;
    (pSVar2->super_SuffixTreeNode).ConcatLen = 0;
    (pSVar2->super_SuffixTreeNode)._vptr_SuffixTreeNode = (_func_int **)&PTR_getEndIdx_01097650;
    *(uint *)&(pSVar2->super_SuffixTreeNode).field_0x14 = EndIdx;
    pSVar2->Link = pSVar1;
    (pSVar2->Children)._M_h._M_buckets = &(pSVar2->Children)._M_h._M_single_bucket;
    (pSVar2->Children)._M_h._M_bucket_count = 1;
    (pSVar2->Children)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pSVar2->Children)._M_h._M_element_count = 0;
    (pSVar2->Children)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pSVar2->Children)._M_h._M_rehash_policy._M_next_resize = 0;
    (pSVar2->Children)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    if (Parent != (SuffixTreeInternalNode *)0x0) {
      ppSVar3 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&Parent->Children,local_34);
      *ppSVar3 = (mapped_type)pSVar2;
    }
    return pSVar2;
  }
  __assert_fail("!(!Parent && StartIdx != SuffixTreeNode::EmptyIdx) && \"Non-root internal nodes must have parents!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/suffix_tree.cpp"
                ,0x4a,
                "SuffixTreeInternalNode *wasm::SuffixTree::insertInternalNode(SuffixTreeInternalNode *, unsigned int, unsigned int, unsigned int)"
               );
}

Assistant:

SuffixTreeInternalNode*
SuffixTree::insertInternalNode(SuffixTreeInternalNode* Parent,
                               unsigned StartIdx,
                               unsigned EndIdx,
                               unsigned Edge) {
  assert(StartIdx <= EndIdx && "String can't start after it ends!");
  assert(!(!Parent && StartIdx != SuffixTreeNode::EmptyIdx) &&
         "Non-root internal nodes must have parents!");
  auto* N = new (InternalNodeAllocator.Allocate())
    SuffixTreeInternalNode(StartIdx, EndIdx, Root);
  if (Parent) {
    Parent->Children[Edge] = N;
  }
  return N;
}